

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divceil.hpp
# Opt level: O3

enable_if_t<std::is_signed<short>::value_&&_(std::is_signed<signed_char>::value____(std::is_unsigned<signed_char>::value_&&_std::is_signed<std::common_type_t<short,_signed_char>_>::value)),_short>
 burst::divceil<short,signed_char>(Integer<short> n,Integer<signed_char> divisor)

{
  short sVar1;
  domain_error *this;
  
  if ('\0' < divisor) {
    if (n < 1) {
      sVar1 = -(short)((-(uint)(ushort)n & 0xffff) / (uint)(byte)divisor);
    }
    else {
      sVar1 = (short)(((ushort)n - 1 & 0xffff) / (uint)(byte)divisor) + 1;
    }
    return sVar1;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::domain_error::domain_error(this,anon_var_dwarf_1f0b1);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

constexpr auto divceil (Integer<I> n, Integer<J> divisor)
    {
        if (divisor > 0)
        {
            return detail::divceil_impl(n, divisor);
        }
        else
        {
            throw std::domain_error("Целая часть от деления на неположительное число не определена.");
        }
    }